

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

int __thiscall Sudoku::smazat(Sudoku *this,int x,int y)

{
  byte bVar1;
  int iVar2;
  sudoku_policko sVar3;
  int iVar4;
  uint y_00;
  ulong uVar5;
  int iVar6;
  Sudoku temp;
  
  sVar3 = (this->s).pole[y * 9 + x];
  iVar6 = 0;
  if (((uint)sVar3 & 0x10) == 0 && ((uint)sVar3 & 0xf) != 0) {
    uVar5 = 0;
    memset(&temp,0,0x1bc);
    iVar6 = 0;
    while( true ) {
      if (uVar5 == 0x51) break;
      y_00 = (uint)(byte)(((ushort)uVar5 & 0xff) / 9);
      iVar2 = (int)((uVar5 & 0xffffffff) / 9);
      if ((y_00 != y) || (iVar4 = 1, iVar2 * 9 + x != (int)uVar5)) {
        bVar1 = *(byte *)((this->s).pole + uVar5);
        iVar4 = iVar6;
        if ((bVar1 & 0xf) != 0) {
          doplnM(&temp,iVar2 * -9 + (int)uVar5,y_00,bVar1 & 0xf);
          *(byte *)(temp.s.pole + uVar5) = *(byte *)(temp.s.pole + uVar5) & 0xef | bVar1 & 0x10;
        }
      }
      uVar5 = uVar5 + 1;
      iVar6 = iVar4;
    }
    memcpy(this,&temp,0x1bc);
  }
  return iVar6;
}

Assistant:

int Sudoku::smazat ( int x, int y )
{
  int u,v, smazano = false;
  if(!s.pole[y*9+x].zapsane || s.pole[y*9+x].pevne) // pokud na pozici nic neni nebo je tam pevne cislo, nic se nedeje
    return false;
  Sudoku temp (-1); // prazdne sudoku pro doplnovani
  // projdeme vse
  for (int i = 0;i < 81; i++)
  {
    // vynechavame pri kopirovani mazane policko
    if(i/9 == y && i%9 == x)
    {
      smazano = true;
      continue;
    }
    // nezapisujeme prazdna policka, doslo by k zaseknuti
    if (!s.pole[i].zapsane)
      continue;
    // doplnime zpet policko
    temp.doplnM (i%9, i/9, s.pole[i].zapsane);
    temp.s.pole[i].pevne = s.pole[i].pevne;
  }
  s = temp.s; // preneseni stavu do tohoto sudoku z docasneho
  return smazano;
}